

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O0

MoveList * megumax::get_pv(UCTNode *node,int max_length)

{
  bool bVar1;
  reference this;
  int in_EDX;
  UCTNode *in_RSI;
  MoveList *in_RDI;
  uint idx;
  int ply;
  MoveList *move_list;
  MoveList *in_stack_ffffffffffffff68;
  reference in_stack_ffffffffffffff70;
  vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_> *in_stack_ffffffffffffff80;
  int local_1c;
  UCTNode *local_10;
  
  libchess::MoveList::MoveList((MoveList *)in_stack_ffffffffffffff80);
  local_1c = 0;
  local_10 = in_RSI;
  while( true ) {
    UCTNode::children(local_10);
    bVar1 = std::vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>::empty
                      (in_stack_ffffffffffffff80);
    if (bVar1 || in_EDX <= local_1c) break;
    UCTNode::children(local_10);
    select_most_visited_child_index(in_stack_ffffffffffffff80);
    UCTNode::children(local_10);
    this = std::vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>::at
                     ((vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_> *)
                      in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff80 =
         (vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_> *)UCTNode::move(this);
    libchess::MoveList::add
              (in_stack_ffffffffffffff68,
               (Move)(value_type)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    UCTNode::children(local_10);
    in_stack_ffffffffffffff70 =
         std::vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>::at
                   ((vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_> *)
                    in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
    local_1c = local_1c + 1;
    local_10 = in_stack_ffffffffffffff70;
  }
  return in_RDI;
}

Assistant:

MoveList get_pv(UCTNode* node, const int max_length = 8) {
    MoveList move_list;
    int ply = 0;
    while (!node->children().empty() && ply < max_length) {
        const auto idx = select_most_visited_child_index(node->children());
        move_list.add(node->children().at(idx).move());
        node = &node->children().at(idx);
        ply++;
    }
    return move_list;
}